

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

void fai_save(faidx_t *fai,FILE *fp)

{
  kh_s_t *h;
  kh_cstr_t key;
  faidx1_t *pfVar1;
  khint_t kVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined4 uVar4;
  
  for (lVar3 = 0; uVar4 = (undefined4)((ulong)in_RAX >> 0x20), lVar3 < fai->n; lVar3 = lVar3 + 1) {
    h = fai->hash;
    key = fai->name[lVar3];
    kVar2 = kh_get_s(h,key);
    pfVar1 = h->vals;
    in_RAX = CONCAT44(uVar4,pfVar1[kVar2].line_len);
    fprintf((FILE *)fp,"%s\t%d\t%lld\t%d\t%d\n",key,(ulong)(uint)pfVar1[kVar2].len,
            pfVar1[kVar2].offset,(ulong)(uint)pfVar1[kVar2].line_blen,in_RAX);
  }
  return;
}

Assistant:

void fai_save(const faidx_t *fai, FILE *fp)
{
    khint_t k;
    int i;
    for (i = 0; i < fai->n; ++i) {
        faidx1_t x;
        k = kh_get(s, fai->hash, fai->name[i]);
        x = kh_value(fai->hash, k);
#ifdef _WIN32
        fprintf(fp, "%s\t%d\t%ld\t%d\t%d\n", fai->name[i], (int)x.len, (long)x.offset, (int)x.line_blen, (int)x.line_len);
#else
        fprintf(fp, "%s\t%d\t%lld\t%d\t%d\n", fai->name[i], (int)x.len, (long long)x.offset, (int)x.line_blen, (int)x.line_len);
#endif
    }
}